

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void YUY2ToARGBRow_C(uint8_t *src_yuy2,uint8_t *rgb_buf,YuvConstants *yuvconstants,int width)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  short sVar6;
  short sVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint8_t uVar11;
  
  if (1 < width) {
    iVar8 = 0;
    do {
      bVar1 = src_yuy2[1];
      uVar10 = (int)yuvconstants->kYToRgb[0] * (uint)*src_yuy2 * 0x101 >> 0x10;
      iVar9 = ((int)yuvconstants->kUVBiasB[0] - (int)yuvconstants->kUVToB[0] * (uint)bVar1) + uVar10
      ;
      if (iVar9 >> 6 < 1) {
        iVar9 = 0;
      }
      iVar9 = iVar9 >> 6;
      if (0xfe < iVar9) {
        iVar9 = 0xff;
      }
      bVar2 = src_yuy2[3];
      cVar3 = yuvconstants->kUVToG[0];
      cVar4 = yuvconstants->kUVToG[1];
      cVar5 = yuvconstants->kUVToR[1];
      sVar6 = yuvconstants->kUVBiasG[0];
      sVar7 = yuvconstants->kUVBiasR[0];
      *rgb_buf = (uint8_t)iVar9;
      iVar9 = ((int)sVar6 - ((int)cVar4 * (uint)bVar2 + (int)cVar3 * (uint)bVar1)) + uVar10;
      if (iVar9 >> 6 < 1) {
        iVar9 = 0;
      }
      iVar9 = iVar9 >> 6;
      if (0xfe < iVar9) {
        iVar9 = 0xff;
      }
      rgb_buf[1] = (uint8_t)iVar9;
      iVar9 = ((int)sVar7 - (int)cVar5 * (uint)bVar2) + uVar10;
      if (iVar9 >> 6 < 1) {
        iVar9 = 0;
      }
      iVar9 = iVar9 >> 6;
      if (0xfe < iVar9) {
        iVar9 = 0xff;
      }
      rgb_buf[2] = (uint8_t)iVar9;
      rgb_buf[3] = 0xff;
      bVar1 = src_yuy2[1];
      bVar2 = src_yuy2[3];
      cVar3 = yuvconstants->kUVToG[0];
      cVar4 = yuvconstants->kUVToG[1];
      cVar5 = yuvconstants->kUVToR[1];
      sVar6 = yuvconstants->kUVBiasG[0];
      sVar7 = yuvconstants->kUVBiasR[0];
      uVar10 = (int)yuvconstants->kYToRgb[0] * (uint)src_yuy2[2] * 0x101 >> 0x10;
      iVar9 = ((int)yuvconstants->kUVBiasB[0] - (int)yuvconstants->kUVToB[0] * (uint)bVar1) + uVar10
      ;
      if (iVar9 >> 6 < 1) {
        iVar9 = 0;
      }
      iVar9 = iVar9 >> 6;
      if (0xfe < iVar9) {
        iVar9 = 0xff;
      }
      rgb_buf[4] = (uint8_t)iVar9;
      iVar9 = ((int)sVar6 - ((int)cVar4 * (uint)bVar2 + (int)cVar3 * (uint)bVar1)) + uVar10;
      if (iVar9 >> 6 < 1) {
        iVar9 = 0;
      }
      iVar9 = iVar9 >> 6;
      if (0xfe < iVar9) {
        iVar9 = 0xff;
      }
      rgb_buf[5] = (uint8_t)iVar9;
      iVar9 = ((int)sVar7 - (int)cVar5 * (uint)bVar2) + uVar10;
      if (iVar9 >> 6 < 1) {
        iVar9 = 0;
      }
      iVar9 = iVar9 >> 6;
      if (0xfe < iVar9) {
        iVar9 = 0xff;
      }
      rgb_buf[6] = (uint8_t)iVar9;
      rgb_buf[7] = 0xff;
      src_yuy2 = src_yuy2 + 4;
      rgb_buf = rgb_buf + 8;
      iVar8 = iVar8 + 2;
    } while (iVar8 < width + -1);
  }
  if ((width & 1U) != 0) {
    bVar1 = src_yuy2[1];
    bVar2 = src_yuy2[3];
    cVar3 = yuvconstants->kUVToG[0];
    cVar4 = yuvconstants->kUVToG[1];
    cVar5 = yuvconstants->kUVToR[1];
    sVar6 = yuvconstants->kUVBiasG[0];
    sVar7 = yuvconstants->kUVBiasR[0];
    uVar10 = (int)yuvconstants->kYToRgb[0] * (uint)*src_yuy2 * 0x101 >> 0x10;
    iVar8 = (int)(((int)yuvconstants->kUVBiasB[0] - (int)yuvconstants->kUVToB[0] * (uint)bVar1) +
                 uVar10) >> 6;
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    uVar11 = (uint8_t)iVar8;
    if (0xfe < iVar8) {
      uVar11 = 0xff;
    }
    *rgb_buf = uVar11;
    iVar8 = (int)(((int)sVar6 - ((int)cVar4 * (uint)bVar2 + (int)cVar3 * (uint)bVar1)) + uVar10) >>
            6;
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    uVar11 = (uint8_t)iVar8;
    if (0xfe < iVar8) {
      uVar11 = 0xff;
    }
    rgb_buf[1] = uVar11;
    iVar8 = (int)(((int)sVar7 - (int)cVar5 * (uint)bVar2) + uVar10) >> 6;
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    uVar11 = (uint8_t)iVar8;
    if (0xfe < iVar8) {
      uVar11 = 0xff;
    }
    rgb_buf[2] = uVar11;
    rgb_buf[3] = 0xff;
  }
  return;
}

Assistant:

void YUY2ToARGBRow_C(const uint8_t* src_yuy2,
                     uint8_t* rgb_buf,
                     const struct YuvConstants* yuvconstants,
                     int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel(src_yuy2[0], src_yuy2[1], src_yuy2[3], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
    YuvPixel(src_yuy2[2], src_yuy2[1], src_yuy2[3], rgb_buf + 4, rgb_buf + 5,
             rgb_buf + 6, yuvconstants);
    rgb_buf[7] = 255;
    src_yuy2 += 4;
    rgb_buf += 8;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel(src_yuy2[0], src_yuy2[1], src_yuy2[3], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
  }
}